

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int on_ack_streams_blocked
              (quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,quicly_sent_t *sent)

{
  quicly_sentmap_t *pqVar1;
  ulong uVar2;
  long lVar3;
  byte *pbVar4;
  quicly_sent_t **ppqVar5;
  
  pqVar1 = map + 3;
  if ((sent->data).max_streams.uni != 0) {
    pqVar1 = map + 2;
  }
  ppqVar5 = &pqVar1->_pending_packet;
  if (acked == 0) {
    lVar3 = (long)ppqVar5[3];
    if (lVar3 == 0) {
      __assert_fail("m->num_inflight != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/maxsender.h"
                    ,0x80,
                    "void quicly_maxsender_lost(quicly_maxsender_t *, quicly_maxsender_sent_t *)");
    }
  }
  else {
    uVar2 = (sent->data).ack.range.end;
    if ((long)ppqVar5[2] < (long)(uVar2 >> 1)) {
      ppqVar5[2] = (quicly_sent_t *)(uVar2 >> 1);
      uVar2 = (sent->data).ack.range.end;
    }
    if ((uVar2 & 1) == 0) {
      return 0;
    }
    lVar3 = (long)ppqVar5[3];
    if (lVar3 == 0) {
      __assert_fail("m->num_inflight != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/maxsender.h"
                    ,0x77,
                    "void quicly_maxsender_acked(quicly_maxsender_t *, quicly_maxsender_sent_t *)");
    }
  }
  pbVar4 = (byte *)((long)&sent->data + 8);
  ppqVar5[3] = (quicly_sent_t *)(lVar3 + -1);
  *pbVar4 = *pbVar4 & 0xfe;
  return 0;
}

Assistant:

static int on_ack_streams_blocked(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));
    struct st_quicly_max_streams_t *m =
        sent->data.streams_blocked.uni ? &conn->egress.max_streams.uni : &conn->egress.max_streams.bidi;

    if (acked) {
        quicly_maxsender_acked(&m->blocked_sender, &sent->data.streams_blocked.args);
    } else {
        quicly_maxsender_lost(&m->blocked_sender, &sent->data.streams_blocked.args);
    }

    return 0;
}